

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_flac_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                      void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                      ma_allocation_callbacks *pAllocationCallbacks,ma_flac *pFlac)

{
  ma_result mVar1;
  ma_dr_flac *pmVar2;
  
  mVar1 = ma_flac_init_internal(pConfig,pFlac);
  if ((mVar1 == MA_SUCCESS) &&
     (mVar1 = MA_INVALID_ARGS, onSeek != (ma_seek_proc)0x0 && onRead != (ma_read_proc)0x0)) {
    pFlac->onRead = onRead;
    pFlac->onSeek = onSeek;
    pFlac->onTell = onTell;
    pFlac->pReadSeekTellUserData = pReadSeekTellUserData;
    pmVar2 = ma_dr_flac_open_with_metadata_private
                       (ma_flac_dr_callback__read,ma_flac_dr_callback__seek,
                        (ma_dr_flac_meta_proc)0x0,ma_dr_flac_container_unknown,pFlac,pFlac,
                        pAllocationCallbacks);
    pFlac->dr = pmVar2;
    mVar1 = MA_INVALID_FILE;
    if (pmVar2 != (ma_dr_flac *)0x0) {
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_flac_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_flac* pFlac)
{
    ma_result result;

    result = ma_flac_init_internal(pConfig, pFlac);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pFlac->onRead = onRead;
    pFlac->onSeek = onSeek;
    pFlac->onTell = onTell;
    pFlac->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_FLAC)
    {
        pFlac->dr = ma_dr_flac_open(ma_flac_dr_callback__read, ma_flac_dr_callback__seek, pFlac, pAllocationCallbacks);
        if (pFlac->dr == NULL) {
            return MA_INVALID_FILE;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}